

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O1

PLSample __thiscall
pbrt::PiecewiseLinear2D<2UL>::Invert(PiecewiseLinear2D<2UL> *this,Vector2f sample,Float *param)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *pvVar6;
  float *pfVar7;
  float *pfVar8;
  float fVar9;
  float fVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar16;
  ulong uVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  bool bVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 in_register_00001208 [56];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  float w1;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 in_ZMM26 [64];
  PLSample PVar51;
  float local_48 [6];
  float param_weight [4];
  ulong uVar15;
  
  auVar41._8_56_ = in_register_00001208;
  auVar41._0_8_ = sample.super_Tuple2<pbrt::Vector2,_float>;
  pvVar6 = (this->m_param_values).ptr;
  iVar12 = 0;
  lVar16 = 0;
  do {
    uVar22 = this->m_param_size[lVar16];
    if ((ulong)uVar22 == 1) {
      uVar3 = vmovlps_avx(SUB6416(ZEXT464(0x3f800000),0));
      *(undefined8 *)(local_48 + lVar16 * 2) = uVar3;
    }
    else {
      uVar17 = (ulong)uVar22 - 2;
      lVar19 = 1;
      if (2 < uVar22) {
        lVar19 = 1;
        uVar15 = uVar17;
        do {
          uVar14 = uVar15 >> 1;
          if (pvVar6[lVar16].ptr[uVar14 + lVar19 & 0xffffffff] <= param[lVar16]) {
            lVar19 = uVar14 + 1 + lVar19;
            uVar14 = ~uVar14 + uVar15;
          }
          uVar15 = uVar14;
        } while (0 < (long)uVar14);
      }
      if (lVar19 - 1U < uVar17) {
        uVar17 = lVar19 - 1U;
      }
      if (lVar19 < 1) {
        uVar17 = 0;
      }
      pfVar7 = pvVar6[lVar16].ptr;
      fVar1 = pfVar7[uVar17 & 0xffffffff];
      auVar26 = ZEXT416((uint)((param[lVar16] - fVar1) / (pfVar7[(int)uVar17 + 1] - fVar1)));
      auVar25 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar26);
      uVar3 = vcmpss_avx512f(auVar26,ZEXT816(0) << 0x40,1);
      fVar1 = (float)((uint)!(bool)((byte)uVar3 & 1) * auVar25._0_4_);
      local_48[lVar16 * 2 + 1] = fVar1;
      local_48[lVar16 * 2] = 1.0 - fVar1;
      iVar12 = (int)uVar17 * this->m_param_strides[lVar16] + iVar12;
    }
    bVar24 = lVar16 == 0;
    lVar16 = lVar16 + 1;
  } while (bVar24);
  fVar1 = (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.x;
  fVar9 = sample.super_Tuple2<pbrt::Vector2,_float>.x * fVar1;
  fVar2 = (this->m_inv_patch_size).super_Tuple2<pbrt::Vector2,_float>.y;
  auVar25 = vmovshdup_avx(auVar41._0_16_);
  fVar10 = auVar25._0_4_ * fVar2;
  iVar21 = (int)fVar9;
  iVar11 = (int)fVar10;
  iVar4 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.x;
  iVar5 = (this->m_size).super_Tuple2<pbrt::Vector2,_int>.y;
  if (iVar4 + -2 < iVar21) {
    iVar21 = iVar4 + -2;
  }
  if (iVar5 + -2 < iVar11) {
    iVar11 = iVar5 + -2;
  }
  iVar18 = iVar5 * iVar4;
  iVar13 = iVar18 * iVar12 + iVar11 * iVar4;
  uVar22 = iVar21 + iVar13;
  pfVar7 = (this->m_data).ptr;
  iVar20 = this->m_param_strides[1] * iVar18;
  uVar23 = uVar22 + iVar20;
  iVar18 = iVar18 * this->m_param_strides[0];
  uVar17 = (ulong)(iVar18 + uVar22);
  uVar15 = (ulong)(iVar18 + uVar23);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(pfVar7 + uVar22);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(pfVar7 + uVar23);
  auVar37._4_4_ = local_48[1];
  auVar37._0_4_ = local_48[1];
  auVar37._8_4_ = local_48[1];
  auVar37._12_4_ = local_48[1];
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(pfVar7 + (long)iVar4 + (ulong)uVar22);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(pfVar7 + (long)iVar4 + (ulong)uVar23);
  pfVar8 = (this->m_conditional_cdf).ptr;
  auVar25 = vmulss_avx512f(auVar37,ZEXT416((uint)pfVar8[(long)iVar4 + uVar17]));
  auVar26 = vbroadcastss_avx512vl(ZEXT416((uint)local_48[0]));
  auVar27 = vfmadd231ss_avx512f(ZEXT416((uint)(local_48[1] * pfVar8[uVar17])),auVar26,
                                ZEXT416((uint)pfVar8[uVar22]));
  auVar28 = vfmadd231ss_avx512f(auVar25,auVar26,ZEXT416((uint)pfVar8[(long)iVar4 + (ulong)uVar22]));
  auVar25 = vmulss_avx512f(auVar37,ZEXT416((uint)pfVar8[uVar15]));
  auVar29 = vmulss_avx512f(auVar37,ZEXT416((uint)pfVar8[(long)iVar4 + uVar15]));
  auVar30 = vfmadd231ss_avx512f(auVar25,auVar26,ZEXT416((uint)pfVar8[uVar23]));
  auVar31 = vfmadd231ss_avx512f(auVar29,auVar26,ZEXT416((uint)pfVar8[(long)iVar4 + (ulong)uVar23]));
  uVar22 = iVar4 + -1 + iVar13;
  auVar25 = vmulss_avx512f(auVar37,ZEXT416((uint)pfVar8[iVar18 + uVar22]));
  auVar32 = vfmadd231ss_avx512f(auVar25,auVar26,ZEXT416((uint)pfVar8[uVar22]));
  auVar25 = vmulss_avx512f(auVar37,ZEXT416((uint)pfVar8[uVar22 + iVar20 + iVar18]));
  auVar33 = vfmadd231ss_avx512f(auVar25,auVar26,ZEXT416((uint)pfVar8[uVar22 + iVar20]));
  uVar22 = iVar13 + -1 + iVar4 * 2;
  auVar25 = vmulss_avx512f(auVar37,ZEXT416((uint)pfVar8[iVar18 + uVar22]));
  auVar34 = vfmadd231ss_avx512f(auVar25,auVar26,ZEXT416((uint)pfVar8[uVar22]));
  auVar25 = vmulss_avx512f(auVar37,ZEXT416((uint)pfVar8[iVar18 + iVar20 + uVar22]));
  auVar35 = vfmadd231ss_avx512f(auVar25,auVar26,ZEXT416((uint)pfVar8[iVar20 + uVar22]));
  uVar22 = iVar12 * iVar5 + iVar11;
  pfVar8 = (this->m_marginal_cdf).ptr;
  iVar12 = iVar5 * this->m_param_strides[0];
  auVar25 = vmulss_avx512f(auVar37,ZEXT416((uint)pfVar8[iVar12 + uVar22]));
  uVar23 = this->m_param_strides[1] * iVar5 + uVar22;
  auVar36 = vfmadd231ss_avx512f(auVar25,auVar26,ZEXT416((uint)pfVar8[uVar22]));
  auVar25 = vmulss_avx512f(auVar37,ZEXT416((uint)pfVar8[iVar12 + uVar23]));
  auVar37 = vfmadd231ss_avx512f(auVar25,auVar26,ZEXT416((uint)pfVar8[uVar23]));
  auVar25 = vcvtsi2ss_avx512f(in_ZMM26._0_16_,iVar11);
  fVar9 = fVar9 - (float)iVar21;
  auVar25 = vsubss_avx512f(ZEXT416((uint)fVar10),auVar25);
  auVar29._0_4_ = local_48[1] * (float)*(undefined8 *)(pfVar7 + uVar17);
  auVar29._4_4_ = local_48[1] * (float)((ulong)*(undefined8 *)(pfVar7 + uVar17) >> 0x20);
  auVar29._8_4_ = local_48[1] * 0.0;
  auVar29._12_4_ = local_48[1] * 0.0;
  auVar29 = vfmadd231ps_avx512vl(auVar29,auVar26,auVar42);
  auVar43._0_4_ = local_48[1] * (float)*(undefined8 *)(pfVar7 + uVar15);
  auVar43._4_4_ = local_48[1] * (float)((ulong)*(undefined8 *)(pfVar7 + uVar15) >> 0x20);
  auVar43._8_4_ = local_48[1] * 0.0;
  auVar43._12_4_ = local_48[1] * 0.0;
  auVar38 = vfmadd231ps_avx512vl(auVar43,auVar26,auVar46);
  auVar44._0_4_ = local_48[1] * (float)*(undefined8 *)(pfVar7 + (long)iVar4 + uVar17);
  auVar44._4_4_ =
       local_48[1] * (float)((ulong)*(undefined8 *)(pfVar7 + (long)iVar4 + uVar17) >> 0x20);
  auVar44._8_4_ = local_48[1] * 0.0;
  auVar44._12_4_ = local_48[1] * 0.0;
  auVar39 = vfmadd231ps_avx512vl(auVar44,auVar26,auVar48);
  auVar45._0_4_ = local_48[1] * (float)*(undefined8 *)(pfVar7 + (long)iVar4 + uVar15);
  auVar45._4_4_ =
       local_48[1] * (float)((ulong)*(undefined8 *)(pfVar7 + (long)iVar4 + uVar15) >> 0x20);
  auVar45._8_4_ = local_48[1] * 0.0;
  auVar45._12_4_ = local_48[1] * 0.0;
  fVar40 = auVar25._0_4_;
  fVar10 = 1.0 - fVar40;
  auVar26 = vfmadd231ps_avx512vl(auVar45,auVar26,auVar50);
  auVar47._4_4_ = local_48[3];
  auVar47._0_4_ = local_48[3];
  auVar47._8_4_ = local_48[3];
  auVar47._12_4_ = local_48[3];
  auVar49._4_4_ = local_48[2];
  auVar49._0_4_ = local_48[2];
  auVar49._8_4_ = local_48[2];
  auVar49._12_4_ = local_48[2];
  auVar25._0_4_ = local_48[3] * auVar38._0_4_;
  auVar25._4_4_ = local_48[3] * auVar38._4_4_;
  auVar25._8_4_ = local_48[3] * auVar38._8_4_;
  auVar25._12_4_ = local_48[3] * auVar38._12_4_;
  auVar25 = vfmadd231ps_fma(auVar25,auVar49,auVar29);
  auVar38._0_4_ = local_48[3] * auVar26._0_4_;
  auVar38._4_4_ = local_48[3] * auVar26._4_4_;
  auVar38._8_4_ = local_48[3] * auVar26._8_4_;
  auVar38._12_4_ = local_48[3] * auVar26._12_4_;
  auVar26 = vfmadd231ps_fma(auVar38,auVar49,auVar39);
  auVar39._0_4_ = fVar40 * auVar26._0_4_;
  auVar39._4_4_ = fVar40 * auVar26._4_4_;
  auVar39._8_4_ = fVar40 * auVar26._8_4_;
  auVar39._12_4_ = fVar40 * auVar26._12_4_;
  auVar26._4_4_ = fVar10;
  auVar26._0_4_ = fVar10;
  auVar26._8_4_ = fVar10;
  auVar26._12_4_ = fVar10;
  auVar26 = vfmadd213ps_fma(auVar26,auVar25,auVar39);
  auVar25 = vmovshdup_avx(auVar26);
  auVar29 = vfmadd231ss_fma(ZEXT416((uint)(fVar9 * auVar25._0_4_)),auVar26,
                            ZEXT416((uint)(1.0 - fVar9)));
  auVar25 = vfmadd213ss_fma(ZEXT416((uint)(auVar25._0_4_ - auVar26._0_4_)),
                            ZEXT416((uint)(fVar9 * 0.5)),auVar26);
  auVar26 = vmulss_avx512f(auVar47,auVar30);
  auVar26 = vfmadd231ss_fma(auVar26,auVar49,auVar27);
  auVar27 = vmulss_avx512f(auVar47,auVar31);
  auVar27 = vfmadd231ss_avx512f(auVar27,auVar49,auVar28);
  auVar27 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * auVar27._0_4_)),ZEXT416((uint)fVar10),auVar26);
  auVar26 = vmulss_avx512f(auVar47,auVar33);
  auVar26 = vfmadd231ss_avx512f(auVar26,auVar49,auVar32);
  auVar28 = vmulss_avx512f(auVar47,auVar35);
  auVar30 = vfmadd231ss_avx512f(auVar28,auVar49,auVar34);
  auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar40 * auVar30._0_4_)),auVar26,ZEXT416((uint)fVar10));
  auVar26 = vfmadd213ss_fma(ZEXT416((uint)(auVar30._0_4_ - auVar26._0_4_)),
                            ZEXT416((uint)(fVar40 * 0.5)),auVar26);
  auVar30 = vmulss_avx512f(auVar47,auVar37);
  auVar30 = vfmadd231ss_avx512f(auVar30,auVar49,auVar36);
  auVar25 = vinsertps_avx(ZEXT416((uint)((fVar9 * auVar25._0_4_ + auVar27._0_4_) / auVar28._0_4_)),
                          ZEXT416((uint)(fVar40 * auVar26._0_4_ + auVar30._0_4_)),0x10);
  PVar51.p.super_Tuple2<pbrt::Vector2,_float> = auVar25._0_8_;
  PVar51.pdf = auVar29._0_4_ * fVar1 * fVar2;
  return PVar51;
}

Assistant:

PBRT_CPU_GPU
    PLSample Invert(Vector2f sample, const Float *param = nullptr) const {
        /* Look up parameter-related indices and weights (if Dimension != 0) */
        float param_weight[2 * ArraySize];
        uint32_t slice_offset = 0u;
        for (size_t dim = 0; dim < Dimension; ++dim) {
            if (m_param_size[dim] == 1) {
                param_weight[2 * dim] = 1.f;
                param_weight[2 * dim + 1] = 0.f;
                continue;
            }

            uint32_t param_index = FindInterval(m_param_size[dim], [&](uint32_t idx) {
                return m_param_values[dim][idx] <= param[dim];
            });

            float p0 = m_param_values[dim][param_index],
                  p1 = m_param_values[dim][param_index + 1];

            param_weight[2 * dim + 1] = Clamp((param[dim] - p0) / (p1 - p0), 0.f, 1.f);
            param_weight[2 * dim] = 1.f - param_weight[2 * dim + 1];
            slice_offset += m_param_strides[dim] * param_index;
        }

        /* Fetch values at corners of bilinear patch */
        sample.x *= m_inv_patch_size.x;
        sample.y *= m_inv_patch_size.y;
        Vector2i pos = Min(Vector2i(sample), m_size - Vector2i(2, 2));
        sample -= Vector2f(pos);

        uint32_t offset = pos.x + pos.y * m_size.x;
        uint32_t slice_size = HProd(m_size);
        if (Dimension != 0)
            offset += slice_offset * slice_size;

        /* Invert the X component */
        float v00 = lookup<Dimension>(m_data.data(), offset, slice_size, param_weight),
              v10 =
                  lookup<Dimension>(m_data.data() + 1, offset, slice_size, param_weight),
              v01 = lookup<Dimension>(m_data.data() + m_size.x, offset, slice_size,
                                      param_weight),
              v11 = lookup<Dimension>(m_data.data() + m_size.x + 1, offset, slice_size,
                                      param_weight);

        Vector2f w1 = sample, w0 = Vector2f(1, 1) - w1;

        float c0 = std::fma(w0.y, v00, w1.y * v01), c1 = std::fma(w0.y, v10, w1.y * v11),
              pdf = std::fma(w0.x, c0, w1.x * c1);

        sample.x *= c0 + .5f * sample.x * (c1 - c0);

        float v0 = lookup<Dimension>(m_conditional_cdf.data(), offset, slice_size,
                                     param_weight),
              v1 = lookup<Dimension>(m_conditional_cdf.data() + m_size.x, offset,
                                     slice_size, param_weight);

        sample.x += (1.f - sample.y) * v0 + sample.y * v1;

        offset = pos.y * m_size.x;
        if (Dimension != 0)
            offset += slice_offset * slice_size;

        float r0 = lookup<Dimension>(m_conditional_cdf.data(), offset + m_size.x - 1,
                                     slice_size, param_weight),
              r1 =
                  lookup<Dimension>(m_conditional_cdf.data(), offset + (m_size.x * 2 - 1),
                                    slice_size, param_weight);

        sample.x /= (1.f - sample.y) * r0 + sample.y * r1;

        /* Invert the Y component */
        sample.y *= r0 + .5f * sample.y * (r1 - r0);

        offset = pos.y;
        if (Dimension != 0)
            offset += slice_offset * m_size.y;

        sample.y +=
            lookup<Dimension>(m_marginal_cdf.data(), offset, m_size.y, param_weight);

        return {sample, pdf * HProd(m_inv_patch_size)};
    }